

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_command_buffer_reset(nk_command_buffer *b)

{
  nk_command_buffer *b_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x21da,"void nk_command_buffer_reset(struct nk_command_buffer *)");
  }
  if (b != (nk_command_buffer *)0x0) {
    b->begin = 0;
    b->end = 0;
    b->last = 0;
    (b->clip).x = -8192.0;
    (b->clip).y = -8192.0;
    (b->clip).w = 16384.0;
    (b->clip).h = 16384.0;
  }
  return;
}

Assistant:

NK_LIB void
nk_command_buffer_reset(struct nk_command_buffer *b)
{
    NK_ASSERT(b);
    if (!b) return;
    b->begin = 0;
    b->end = 0;
    b->last = 0;
    b->clip = nk_null_rect;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    b->userdata.ptr = 0;
#endif
}